

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O0

void printall(void)

{
  uint16_t uVar1;
  uint32_t uVar2;
  float fVar3;
  __type _Var4;
  int i_1;
  double f_1;
  int e;
  float f;
  int i;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_c;
  uint local_4;
  
  for (local_4 = 0; (int)local_4 < 0x10000; local_4 = local_4 + 1) {
    fVar3 = h2f(0);
    uVar2 = floatToBits(fVar3);
    printf("0x%x -> %g 0x%x\n",(double)fVar3,(ulong)local_4,(ulong)uVar2);
  }
  for (local_c = -10; local_c < 10; local_c = local_c + 1) {
    _Var4 = std::pow<double,int>
                      ((double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
    uVar1 = f2h(0.0);
    in_stack_ffffffffffffffc4 = (uint)uVar1;
    fVar3 = h2f(0);
    printf("%g -> 0x%x ->%g\n",_Var4,(double)fVar3,(ulong)in_stack_ffffffffffffffc4);
  }
  return;
}

Assistant:

void printall()
{
    for (int i = 0; i < 65536; i++) {
        float f = h2f(i);
        printf("0x%x -> %g 0x%x\n", i, f, floatToBits(f));
    }
    for (int e = -10; e < 10; e++) {
        double f = pow(10.0, e);
        int i = f2h(f);
        printf("%g -> 0x%x ->%g\n", f, i, h2f(i));
    }
}